

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::Touch(string *filename,bool create)

{
  bool bVar1;
  int iVar2;
  char *__path;
  undefined1 local_48 [8];
  timespec times [2];
  FILE *file;
  bool create_local;
  string *filename_local;
  
  bVar1 = FileExists(filename);
  if (bVar1) {
    local_48 = (undefined1  [8])0x0;
    times[0].tv_sec = 0x3ffffffe;
    times[0].tv_nsec = 0;
    times[1].tv_sec = 0x3fffffff;
    __path = (char *)std::__cxx11::string::c_str();
    iVar2 = utimensat(-100,__path,(timespec *)local_48,0);
    if (iVar2 < 0) {
      filename_local._7_1_ = false;
    }
    else {
      filename_local._7_1_ = true;
    }
  }
  else if (create) {
    times[1].tv_nsec = (__syscall_slong_t)Fopen(filename,"a+b");
    if ((FILE *)times[1].tv_nsec == (FILE *)0x0) {
      filename_local._7_1_ = false;
    }
    else {
      fclose((FILE *)times[1].tv_nsec);
      filename_local._7_1_ = true;
    }
  }
  else {
    filename_local._7_1_ = true;
  }
  return filename_local._7_1_;
}

Assistant:

bool SystemTools::Touch(const kwsys_stl::string& filename, bool create)
{
  if (!SystemTools::FileExists(filename))
    {
    if(create)
      {
      FILE* file = Fopen(filename, "a+b");
      if(file)
        {
        fclose(file);
        return true;
        }
      return false;
      }
    else
      {
      return true;
      }
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
  HANDLE h = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(filename).c_str(),
    FILE_WRITE_ATTRIBUTES,
    FILE_SHARE_WRITE, 0, OPEN_EXISTING,
    FILE_FLAG_BACKUP_SEMANTICS, 0);
  if(!h)
    {
    return false;
    }
  FILETIME mtime;
  GetSystemTimeAsFileTime(&mtime);
  if(!SetFileTime(h, 0, 0, &mtime))
    {
    CloseHandle(h);
    return false;
    }
  CloseHandle(h);
#elif KWSYS_CXX_HAS_UTIMENSAT
  struct timespec times[2] = {{0,UTIME_OMIT},{0,UTIME_NOW}};
  if(utimensat(AT_FDCWD, filename.c_str(), times, 0) < 0)
    {
    return false;
    }
#else
  struct stat st;
  if(stat(filename.c_str(), &st) < 0)
    {
    return false;
    }
  struct timeval mtime;
  gettimeofday(&mtime, 0);
# if KWSYS_CXX_HAS_UTIMES
  struct timeval times[2] =
    {
#  if KWSYS_STAT_HAS_ST_MTIM
      {st.st_atim.tv_sec, st.st_atim.tv_nsec/1000}, /* tv_sec, tv_usec */
#  else
      {st.st_atime, 0},
#  endif
      mtime
    };
  if(utimes(filename.c_str(), times) < 0)
    {
    return false;
    }
# else
  struct utimbuf times = {st.st_atime, mtime.tv_sec};
  if(utime(filename.c_str(), &times) < 0)
    {
    return false;
    }
# endif
#endif
  return true;
}